

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

string * ot::commissioner::StripComments(string *__return_storage_ptr__,string *aStr)

{
  ulong uVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  char cVar7;
  bool bVar8;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar6 = aStr->_M_string_length;
  if (uVar6 != 0) {
    bVar4 = false;
    bVar8 = false;
    uVar5 = 0;
    do {
      pcVar3 = (aStr->_M_dataplus)._M_p;
      uVar1 = uVar5 + 1;
      cVar7 = '\0';
      if (uVar1 < uVar6) {
        cVar7 = pcVar3[uVar1];
      }
      cVar2 = pcVar3[uVar5];
      if (bVar8) {
        uVar6 = uVar5 + 2;
        uVar5 = uVar1;
        if (cVar2 == '*' && cVar7 == '/') {
          uVar5 = uVar6;
          bVar8 = false;
        }
      }
      else {
        if (bVar4) {
          if ((cVar2 != '\r') || (cVar7 != '\n')) {
            uVar5 = uVar1;
            if (cVar2 == '\n') {
              bVar4 = false;
            }
            goto LAB_001703af;
          }
          bVar4 = false;
        }
        else if ((cVar2 == '/') && (cVar7 == '*')) {
          bVar8 = true;
        }
        else {
          if ((cVar2 != '/') || (cVar7 != '/')) {
            std::__cxx11::string::push_back((char)__return_storage_ptr__);
            uVar5 = uVar1;
            goto LAB_001703af;
          }
          bVar4 = true;
        }
        uVar5 = uVar5 + 2;
      }
LAB_001703af:
      uVar6 = aStr->_M_string_length;
    } while (uVar5 < uVar6);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string StripComments(const std::string &aStr)
{
    std::string ret;
    bool        inInlineComment = false;
    bool        inBlockComment  = false;

    for (size_t i = 0; i < aStr.size();)
    {
        int c     = aStr[i];
        int nextc = i + 1 < aStr.size() ? aStr[i + 1] : '\0';

        if (inBlockComment)
        {
            if (c == '*' && nextc == '/')
            {
                inBlockComment = false;
                i += 2;
            }
            else
            {
                ++i;
            }
        }
        else if (inInlineComment)
        {
            if (c == '\r' && nextc == '\n')
            {
                inInlineComment = false;
                i += 2;
            }
            else if (c == '\n')
            {
                inInlineComment = false;
                ++i;
            }
            else
            {
                ++i;
            }
        }
        else
        {
            if (c == '/' && nextc == '*')
            {
                inBlockComment = true;
                i += 2;
            }
            else if (c == '/' && nextc == '/')
            {
                inInlineComment = true;
                i += 2;
            }
            else
            {
                ret.push_back(c);
                ++i;
            }
        }
    }

    return ret;
}